

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
operator()(arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
           *this,basic_string_view<wchar_t> value)

{
  basic_string_view<wchar_t> s;
  iterator iVar1;
  size_t in_RCX;
  void *in_RDX;
  wchar_t *in_RSI;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_> *in_RDI;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  format_specs *in_stack_ffffffffffffffb8;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
  *in_stack_ffffffffffffffc0;
  error_handler local_21 [9];
  wchar_t *local_18;
  void *local_10;
  
  if (in_RDI[1].out_.container == (basic_buffer<wchar_t> *)0x0) {
    basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::write
              (in_RDI,(int)in_RSI,in_RDX,in_RCX);
  }
  else {
    in_stack_ffffffffffffffaf = *(undefined1 *)((long)&(in_RDI[1].out_.container)->size_ + 1);
    local_18 = in_RSI;
    local_10 = in_RDX;
    error_handler::error_handler(local_21);
    check_string_type_spec<char,fmt::v5::internal::error_handler>
              ((char)((ulong)in_RDI >> 0x38),
               (error_handler *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    s.size_ = (size_t)local_10;
    s.data_ = local_18;
    basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
    write<wchar_t>(in_stack_ffffffffffffffc0,s,in_stack_ffffffffffffffb8);
  }
  iVar1 = out((arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
               *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  return (iterator)iVar1.container;
}

Assistant:

iterator operator()(basic_string_view<char_type> value) {
    if (specs_) {
      internal::check_string_type_spec(
            specs_->type, internal::error_handler());
      writer_.write(value, *specs_);
    } else {
      writer_.write(value);
    }
    return out();
  }